

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void duckdb::TemplatedWritePlain<unsigned_long,unsigned_long,duckdb::ParquetCastOperator,false>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  bool bVar1;
  unsigned_long uVar2;
  data_ptr_t pdVar3;
  ulong in_RCX;
  ulong in_RDX;
  long lVar4;
  TemplatedValidityMask<unsigned_long> *in_R9;
  unsigned_long target_value;
  idx_t r;
  idx_t local_write_count;
  unsigned_long local_write [2048];
  unsigned_long *ptr;
  unsigned_long in_stack_ffffffffffffbf98;
  ColumnWriterStatistics *in_stack_ffffffffffffbfa0;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffbfa8;
  ulong local_4048;
  long local_4040;
  unsigned_long local_4038 [2048];
  unsigned_long *local_38;
  TemplatedValidityMask<unsigned_long> *local_30;
  ulong local_20;
  ulong local_18;
  
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_38 = FlatVector::GetData<unsigned_long>((Vector *)0x5a5754);
  local_4040 = 0;
  for (local_4048 = local_18; local_4048 < local_20; local_4048 = local_4048 + 1) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_ffffffffffffbfa8,(idx_t)in_stack_ffffffffffffbfa0);
    if (bVar1) {
      uVar2 = ParquetCastOperator::Operation<unsigned_long,unsigned_long>(local_38[local_4048]);
      ParquetCastOperator::HandleStats<unsigned_long,unsigned_long>
                (in_stack_ffffffffffffbfa0,in_stack_ffffffffffffbf98);
      lVar4 = local_4040 + 1;
      local_4038[local_4040] = uVar2;
      local_4040 = lVar4;
      if (lVar4 == 0x800) {
        in_stack_ffffffffffffbfa8 = local_30;
        pdVar3 = data_ptr_cast<unsigned_long>(local_4038);
        (*(code *)**(undefined8 **)in_stack_ffffffffffffbfa8)
                  (in_stack_ffffffffffffbfa8,pdVar3,0x4000);
        local_4040 = 0;
      }
    }
  }
  pdVar3 = data_ptr_cast<unsigned_long>(local_4038);
  (*(code *)**(undefined8 **)local_30)(local_30,pdVar3,local_4040 << 3);
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}